

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

void __thiscall
Generator_modelWithComplexUnitsOutOfScope_Test::~Generator_modelWithComplexUnitsOutOfScope_Test
          (Generator_modelWithComplexUnitsOutOfScope_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Generator, modelWithComplexUnitsOutOfScope)
{
    libcellml::AnalyserModelPtr analyserModel;

    {
        auto analyser = libcellml::Analyser::create();
        auto parser = libcellml::Parser::create();
        auto importer = libcellml::Importer::create();
        auto model = parser->parseModel(fileContents("generator/cellml_slc_example/slc_model.cellml"));

        EXPECT_EQ(size_t(0), parser->issueCount());

        importer->resolveImports(model, resourcePath("generator/cellml_slc_example"));
        EXPECT_FALSE(model->hasUnresolvedImports());

        model = importer->flattenModel(model);

        analyser->analyseModel(model);
        EXPECT_EQ(size_t(0), analyser->errorCount());

        analyserModel = analyser->model();
    }

    auto generator = libcellml::Generator::create();

    generator->setModel(analyserModel);

    auto profile = libcellml::GeneratorProfile::create(libcellml::GeneratorProfile::Profile::PYTHON);

    generator->setProfile(profile);

    EXPECT_EQ(fileContents("generator/cellml_slc_example/model.py"), generator->implementationCode());
}